

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall Glucose::Clause::shrink(Clause *this,int i)

{
  ulong uVar1;
  int i_local;
  Clause *this_local;
  
  if (((*(ulong *)&this->header >> 4 & 3) != 0) &&
     (*(undefined4 *)
       (&this[1].header.field_0x0 +
       (ulong)(uint)((int)((ulong)*(undefined8 *)&this->header >> 0x20) - i) * 4) =
           *(undefined4 *)(&this[1].header.field_0x0 + (*(ulong *)&this->header >> 0x20) * 4),
     uVar1 = *(ulong *)&this->header >> 4, ((uint)uVar1 & 3) != 1 && (uVar1 & 3) != 0)) {
    *(undefined4 *)
     (&this[1].header.field_0x0 +
     (ulong)(((int)((ulong)*(undefined8 *)&this->header >> 0x20) - i) - 1) * 4) =
         *(undefined4 *)
          (&this[1].header.field_0x0 +
          (ulong)((int)((ulong)*(undefined8 *)&this->header >> 0x20) - 1) * 4);
  }
  *(ulong *)&this->header =
       *(ulong *)&this->header & 0xffffffff |
       (ulong)(uint)((int)((ulong)*(undefined8 *)&this->header >> 0x20) - i) << 0x20;
  return;
}

Assistant:

void         shrink      (int i)         { assert(i <= size()); 
						if (header.extra_size > 0) {
						    data[header.size-i] = data[header.size];
						    if (header.extra_size > 1) { // Special case for imported clauses
							data[header.size-i-1] = data[header.size-1];
						    }
						}
    header.size -= i; }